

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int commit_raw_message(ptls_message_emitter_t *_self)

{
  st_ptls_traffic_protection_t *psVar1;
  ulong uVar2;
  
  uVar2 = _self->enc->epoch;
  if (uVar2 == 1) {
    uVar2 = (ulong)(*(uint8_t *)((long)&(_self[1].buf)->base + (long)_self->buf->base) != '\x01');
  }
  if (uVar2 + 1 < 5) {
    psVar1 = _self[1].enc;
    do {
      if (*(ptls_buffer_t **)(psVar1->secret + uVar2 * 8 + 8) != _self[1].buf) {
        __assert_fail("self->epoch_offsets[epoch] == self->start_off",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                      ,0x146c,"int commit_raw_message(ptls_message_emitter_t *)");
      }
      *(size_t *)(psVar1->secret + uVar2 * 8 + 8) = _self->buf->off;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 4);
  }
  _self[1].buf = (ptls_buffer_t *)0xffffffffffffffff;
  return 0;
}

Assistant:

static int commit_raw_message(ptls_message_emitter_t *_self)
{
    struct st_ptls_raw_message_emitter_t *self = (void *)_self;
    size_t epoch;

    /* epoch is the key epoch, with the only exception being 2nd CH generated after 0-RTT key */
    epoch = self->super.enc->epoch;
    if (epoch == 1 && self->super.buf->base[self->start_off] == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO)
        epoch = 0;

    for (++epoch; epoch < 5; ++epoch) {
        assert(self->epoch_offsets[epoch] == self->start_off);
        self->epoch_offsets[epoch] = self->super.buf->off;
    }

    self->start_off = SIZE_MAX;

    return 0;
}